

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trace.h
# Opt level: O0

bool __thiscall snestistics::OpInfo::operator<(OpInfo *this,OpInfo *other)

{
  OpInfo *other_local;
  OpInfo *this_local;
  
  if (this->DB == other->DB) {
    if (this->DP == other->DP) {
      if (this->indirect_base_pointer == other->indirect_base_pointer) {
        if (this->X == other->X) {
          if (this->Y == other->Y) {
            if (this->P == other->P) {
              if (this->jump_target == other->jump_target) {
                this_local._7_1_ = false;
              }
              else {
                this_local._7_1_ = this->jump_target < other->jump_target;
              }
            }
            else {
              this_local._7_1_ = this->P < other->P;
            }
          }
          else {
            this_local._7_1_ = this->Y < other->Y;
          }
        }
        else {
          this_local._7_1_ = this->X < other->X;
        }
      }
      else {
        this_local._7_1_ = this->indirect_base_pointer < other->indirect_base_pointer;
      }
    }
    else {
      this_local._7_1_ = this->DP < other->DP;
    }
  }
  else {
    this_local._7_1_ = this->DB < other->DB;
  }
  return this_local._7_1_;
}

Assistant:

inline bool operator<(const OpInfo &other) const {
		if (DB != other.DB) return DB < other.DB;
		if (DP != other.DP) return DP < other.DP;
		if (indirect_base_pointer != other.indirect_base_pointer) return indirect_base_pointer < other.indirect_base_pointer;
		if (X != other.X) return X < other.X;
		if (Y != other.Y) return Y < other.Y;
		if (P != other.P) return P < other.P;
		if (jump_target != other.jump_target) return jump_target < other.jump_target;
		return false;
	}